

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::clipPrimitives
               (vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *list,Program *program,
               bool clipWithZPlanes,VertexPacketAllocator *vpalloc)

{
  float x;
  float fVar1;
  Point *pPVar2;
  bool bVar3;
  Point *pPVar4;
  float *pfVar5;
  Point local_70 [3];
  reference local_58;
  Point *p;
  size_t ndx;
  undefined1 local_40 [8];
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> visiblePoints;
  VertexPacketAllocator *vpalloc_local;
  bool clipWithZPlanes_local;
  Program *program_local;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *list_local;
  
  visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)vpalloc;
  std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::vector
            ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_40);
  if (clipWithZPlanes) {
    for (p = (Point *)0x0; pPVar2 = p,
        pPVar4 = (Point *)std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::size(list),
        pPVar2 < pPVar4; p = (Point *)((long)&p->v0 + 1)) {
      local_58 = std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::operator[]
                           (list,(size_type)p);
      pfVar5 = tcu::Vector<float,_4>::z(&local_58->v0->position);
      x = *pfVar5;
      pfVar5 = tcu::Vector<float,_4>::w(&local_58->v0->position);
      fVar1 = *pfVar5;
      pfVar5 = tcu::Vector<float,_4>::w(&local_58->v0->position);
      bVar3 = de::inRange<float>(x,-fVar1,*pfVar5);
      if (bVar3) {
        pa::Point::Point(local_70,local_58->v0);
        std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::push_back
                  ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_40,local_70);
      }
    }
    std::swap<rr::pa::Point,std::allocator<rr::pa::Point>>
              ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_40,list);
    ndx._4_4_ = 0;
  }
  else {
    ndx._4_4_ = 1;
  }
  std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::~vector
            ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_40);
  return;
}

Assistant:

void clipPrimitives (std::vector<pa::Point>&		list,
					 const Program&					program,
					 bool							clipWithZPlanes,
					 VertexPacketAllocator&			vpalloc)
{
	DE_UNREF(vpalloc);
	DE_UNREF(program);

	std::vector<pa::Point> visiblePoints;

	// Z-clipping disabled, don't do anything
	if (!clipWithZPlanes)
		return;

	for (size_t ndx = 0; ndx < list.size(); ++ndx)
	{
		pa::Point& p = list[ndx];

		// points are discarded if Z is not in range. (Wide) point clipping is done in the rasterization phase
		if (de::inRange(p.v0->position.z(), -p.v0->position.w(), p.v0->position.w()))
			visiblePoints.push_back(pa::Point(p.v0));
	}

	// return visible in list
	std::swap(visiblePoints, list);
}